

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::Configurations::Parser::parseLine
               (string *line,string *currConfigStr,string *currLevelStr,Level *currLevel,
               Configurations *conf)

{
  bool bVar1;
  Level LVar2;
  ConfigurationType configurationType;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  string *psVar7;
  string local_210 [32];
  ulong local_1f0;
  ulong local_1e8;
  string currValue;
  stringstream internalInfoStream;
  ostream local_1a8 [376];
  
  currValue._M_dataplus._M_p = (pointer)&currValue.field_2;
  currValue._M_string_length = 0;
  currValue.field_2._M_local_buf[0] = '\0';
  base::utils::Str::trim((Str *)line,currConfigStr);
  psVar7 = line;
  std::__cxx11::string::_M_assign((string *)line);
  bVar1 = isComment(line);
  bVar6 = true;
  if (!bVar1) {
    ignoreComments(line);
    base::utils::Str::trim((Str *)line,psVar7);
    std::__cxx11::string::_M_assign((string *)line);
    if (line->_M_string_length != 0) {
      bVar1 = isLevel(line);
      if (bVar1) {
        if (2 < line->_M_string_length) {
          std::__cxx11::string::substr((ulong)&internalInfoStream,(ulong)line);
          std::__cxx11::string::operator=((string *)currLevelStr,(string *)&internalInfoStream);
          std::__cxx11::string::~string((string *)&internalInfoStream);
          base::utils::Str::toUpper(currLevelStr);
          psVar7 = currLevelStr;
          std::__cxx11::string::_M_assign((string *)currLevelStr);
          base::utils::Str::trim((Str *)currLevelStr,psVar7);
          std::__cxx11::string::_M_assign((string *)currLevelStr);
          LVar2 = LevelHelper::convertFromString((currLevelStr->_M_dataplus)._M_p);
          *currLevel = LVar2;
        }
      }
      else {
        bVar1 = isConfig(line);
        configurationType = Unknown;
        if (bVar1) {
          std::__cxx11::string::find((char)line,0x3d);
          std::__cxx11::string::substr((ulong)&internalInfoStream,(ulong)line);
          std::__cxx11::string::operator=((string *)currConfigStr,(string *)&internalInfoStream);
          std::__cxx11::string::~string((string *)&internalInfoStream);
          base::utils::Str::toUpper(currConfigStr);
          psVar7 = currConfigStr;
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          base::utils::Str::trim((Str *)currConfigStr,psVar7);
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          configurationType =
               ConfigurationTypeHelper::convertFromString((currConfigStr->_M_dataplus)._M_p);
          std::__cxx11::string::substr((ulong)&internalInfoStream,(ulong)line);
          psVar7 = (string *)&internalInfoStream;
          std::__cxx11::string::operator=((string *)&currValue,(string *)&internalInfoStream);
          std::__cxx11::string::~string((string *)&internalInfoStream);
          base::utils::Str::trim((Str *)&currValue,psVar7);
          std::__cxx11::string::_M_assign((string *)&currValue);
          uVar3 = std::__cxx11::string::find((char *)&currValue,0x1855ff);
          if (uVar3 != 0xffffffffffffffff) {
            local_1f0 = uVar3 + 1;
            local_1e8 = uVar3;
            while (uVar3 = std::__cxx11::string::find((char *)&currValue,0x1855ff),
                  uVar3 != 0xffffffffffffffff) {
              pcVar4 = (char *)std::__cxx11::string::at((ulong)&currValue);
              if (*pcVar4 != '\\') {
                if (uVar3 <= local_1e8) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
                  poVar5 = std::operator<<(local_1a8,
                                           "Configuration error - No ending quote found in [");
                  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
                  std::operator<<(poVar5,"]");
                  poVar5 = std::operator<<((ostream *)&std::cerr,
                                           "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1bb);
                  poVar5 = std::operator<<(poVar5,") [(quotesStart < quotesEnd)");
                  poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
                  std::__cxx11::stringbuf::str();
                  poVar5 = std::operator<<(poVar5,local_210);
                  poVar5 = std::operator<<(poVar5,"\"");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  std::__cxx11::string::~string(local_210);
                  std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
                }
                if (local_1f0 == uVar3) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
                  poVar5 = std::operator<<(local_1a8,"Empty configuration value for [");
                  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
                  std::operator<<(poVar5,"]");
                  poVar5 = std::operator<<((ostream *)&std::cerr,
                                           "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1bc);
                  poVar5 = std::operator<<(poVar5,") [(quotesStart + 1 != quotesEnd)");
                  poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
                  std::__cxx11::stringbuf::str();
                  poVar5 = std::operator<<(poVar5,local_210);
                  poVar5 = std::operator<<(poVar5,"\"");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  std::__cxx11::string::~string(local_210);
                  std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
                }
                else if (local_1e8 != uVar3) {
                  std::__cxx11::string::substr((ulong)&internalInfoStream,(ulong)&currValue);
                  std::__cxx11::string::operator=
                            ((string *)&currValue,(string *)&internalInfoStream);
                  std::__cxx11::string::~string((string *)&internalInfoStream);
                }
                break;
              }
              std::__cxx11::string::erase((ulong)&currValue,uVar3 - 1);
              std::__cxx11::string::_M_assign((string *)&currValue);
            }
          }
        }
        if (*currLevel == Unknown) {
          std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
          poVar5 = std::operator<<(local_1a8,"Unrecognized severity level [");
          poVar5 = std::operator<<(poVar5,(string *)currLevelStr);
          std::operator<<(poVar5,"]");
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1c3);
          poVar5 = std::operator<<(poVar5,") [*currLevel != Level::Unknown");
          poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
          std::__cxx11::stringbuf::str();
          poVar5 = std::operator<<(poVar5,local_210);
          poVar5 = std::operator<<(poVar5,"\"");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
        }
        if (configurationType == Unknown) {
          std::__cxx11::stringstream::stringstream((stringstream *)&internalInfoStream);
          poVar5 = std::operator<<(local_1a8,"Unrecognized configuration [");
          poVar5 = std::operator<<(poVar5,(string *)currConfigStr);
          std::operator<<(poVar5,"]");
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1c4);
          poVar5 = std::operator<<(poVar5,") [currConfig != ConfigurationType::Unknown");
          poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
          std::__cxx11::stringbuf::str();
          poVar5 = std::operator<<(poVar5,local_210);
          poVar5 = std::operator<<(poVar5,"\"");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::stringstream::~stringstream((stringstream *)&internalInfoStream);
        }
        else if (*currLevel != Unknown) {
          set(conf,*currLevel,configurationType,&currValue);
          goto LAB_0016ad0f;
        }
        bVar6 = false;
      }
    }
  }
LAB_0016ad0f:
  std::__cxx11::string::~string((string *)&currValue);
  return bVar6;
}

Assistant:

bool Configurations::Parser::parseLine(std::string* line, std::string* currConfigStr, std::string* currLevelStr,
                                       Level* currLevel,
                                       Configurations* conf) {
  ConfigurationType currConfig = ConfigurationType::Unknown;
  std::string currValue = std::string();
  *line = base::utils::Str::trim(*line);
  if (isComment(*line)) return true;
  ignoreComments(line);
  *line = base::utils::Str::trim(*line);
  if (line->empty()) {
    // Comment ignored
    return true;
  }
  if (isLevel(*line)) {
    if (line->size() <= 2) {
      return true;
    }
    *currLevelStr = line->substr(1, line->size() - 2);
    *currLevelStr = base::utils::Str::toUpper(*currLevelStr);
    *currLevelStr = base::utils::Str::trim(*currLevelStr);
    *currLevel = LevelHelper::convertFromString(currLevelStr->c_str());
    return true;
  }
  if (isConfig(*line)) {
    std::size_t assignment = line->find('=');
    *currConfigStr = line->substr(0, assignment);
    *currConfigStr = base::utils::Str::toUpper(*currConfigStr);
    *currConfigStr = base::utils::Str::trim(*currConfigStr);
    currConfig = ConfigurationTypeHelper::convertFromString(currConfigStr->c_str());
    currValue = line->substr(assignment + 1);
    currValue = base::utils::Str::trim(currValue);
    std::size_t quotesStart = currValue.find("\"", 0);
    std::size_t quotesEnd = std::string::npos;
    if (quotesStart != std::string::npos) {
      quotesEnd = currValue.find("\"", quotesStart + 1);
      while (quotesEnd != std::string::npos && currValue.at(quotesEnd - 1) == '\\') {
        currValue = currValue.erase(quotesEnd - 1, 1);
        quotesEnd = currValue.find("\"", quotesEnd + 2);
      }
    }
    if (quotesStart != std::string::npos && quotesEnd != std::string::npos) {
      // Quote provided - check and strip if valid
      ELPP_ASSERT((quotesStart < quotesEnd), "Configuration error - No ending quote found in ["
                  << currConfigStr << "]");
      ELPP_ASSERT((quotesStart + 1 != quotesEnd), "Empty configuration value for [" << currConfigStr << "]");
      if ((quotesStart != quotesEnd) && (quotesStart + 1 != quotesEnd)) {
        // Explicit check in case if assertion is disabled
        currValue = currValue.substr(quotesStart + 1, quotesEnd - 1);
      }
    }
  }
  ELPP_ASSERT(*currLevel != Level::Unknown, "Unrecognized severity level [" << *currLevelStr << "]");
  ELPP_ASSERT(currConfig != ConfigurationType::Unknown, "Unrecognized configuration [" << *currConfigStr << "]");
  if (*currLevel == Level::Unknown || currConfig == ConfigurationType::Unknown) {
    return false;  // unrecognizable level or config
  }
  conf->set(*currLevel, currConfig, currValue);
  return true;
}